

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_game.cpp
# Opt level: O0

bool __thiscall FCajunMaster::LoadBots(FCajunMaster *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  botinfo_t *pbVar6;
  FTeam *this_00;
  uint local_180;
  byte local_179;
  uint i;
  BYTE teamnum;
  char teamstr [16];
  bool gotclass;
  botinfo_t *newinfo;
  CRecoverableError *err;
  FString local_140;
  uint local_134;
  byte local_12d;
  int loaded_bots;
  bool gotteam;
  FString local_120;
  FString tmp;
  FScanner sc;
  FCajunMaster *this_local;
  
  FScanner::FScanner((FScanner *)&tmp);
  FString::FString(&local_120);
  local_12d = 0;
  local_134 = 0;
  ForgetBots(&bglobal);
  M_GetCajunPath((char *)&local_140);
  FString::operator=(&local_120,&local_140);
  FString::~FString(&local_140);
  bVar1 = FString::IsEmpty(&local_120);
  if (bVar1) {
    DPrintf(1,"No bots.cfg, so no bots\n");
    this_local._7_1_ = false;
  }
  else {
    pcVar5 = FString::operator_cast_to_char_(&local_120);
    FScanner::OpenFile((FScanner *)&tmp,pcVar5);
    while (bVar1 = FScanner::GetString((FScanner *)&tmp), bVar1) {
      bVar1 = FScanner::Compare((FScanner *)&tmp,"{");
      if (!bVar1) {
        FScanner::ScriptError((FScanner *)&tmp,"Unexpected token \'%s\'\n",tmp.Chars);
      }
      pbVar6 = (botinfo_t *)operator_new(0x30);
      bVar1 = false;
      (pbVar6->skill).reaction = 0;
      (pbVar6->skill).isp = 0;
      pbVar6->inuse = 0;
      pbVar6->lastteam = 0;
      pbVar6->info = (char *)0x0;
      (pbVar6->skill).aiming = 0;
      (pbVar6->skill).perfection = 0;
      pbVar6->next = (botinfo_t *)0x0;
      pbVar6->name = (char *)0x0;
      pcVar5 = copystring("\\autoaim\\0\\movebob\\.25");
      pbVar6->info = pcVar5;
      while( true ) {
        FScanner::MustGetString((FScanner *)&tmp);
        bVar2 = FScanner::Compare((FScanner *)&tmp,"}");
        if (bVar2) break;
        iVar3 = FScanner::MatchString((FScanner *)&tmp,BotConfigStrings,8);
        switch(iVar3) {
        case 0:
          FScanner::MustGetString((FScanner *)&tmp);
          appendinfo(&pbVar6->info,"name");
          appendinfo(&pbVar6->info,tmp.Chars);
          pcVar5 = copystring(tmp.Chars);
          pbVar6->name = pcVar5;
          break;
        case 1:
          FScanner::MustGetNumber((FScanner *)&tmp);
          (pbVar6->skill).aiming = sc.StringLen;
          break;
        case 2:
          FScanner::MustGetNumber((FScanner *)&tmp);
          (pbVar6->skill).perfection = sc.StringLen;
          break;
        case 3:
          FScanner::MustGetNumber((FScanner *)&tmp);
          (pbVar6->skill).reaction = sc.StringLen;
          break;
        case 4:
          FScanner::MustGetNumber((FScanner *)&tmp);
          (pbVar6->skill).isp = sc.StringLen;
          break;
        case 5:
          FScanner::MustGetString((FScanner *)&tmp);
          bVar2 = IsNum(tmp.Chars);
          if (bVar2) {
            uVar4 = atoi(tmp.Chars);
            local_179 = (byte)uVar4;
            bVar2 = FTeam::IsValidTeam(&TeamLibrary,uVar4 & 0xff);
            if (!bVar2) {
              local_179 = 0xff;
            }
          }
          else {
            local_179 = 0xff;
            for (local_180 = 0; uVar4 = TArray<FTeam,_FTeam>::Size(&Teams), local_180 < uVar4;
                local_180 = local_180 + 1) {
              this_00 = TArray<FTeam,_FTeam>::operator[](&Teams,(ulong)local_180);
              pcVar5 = FTeam::GetName(this_00);
              iVar3 = strcasecmp(pcVar5,tmp.Chars);
              if (iVar3 == 0) {
                local_179 = (byte)local_180;
                break;
              }
            }
          }
          appendinfo(&pbVar6->info,"team");
          mysnprintf((char *)&i,0x10,"%d",(ulong)local_179);
          appendinfo(&pbVar6->info,(char *)&i);
          local_12d = 1;
          break;
        default:
          iVar3 = strcasecmp(tmp.Chars,"playerclass");
          if (iVar3 == 0) {
            bVar1 = true;
          }
          appendinfo(&pbVar6->info,tmp.Chars);
          FScanner::MustGetString((FScanner *)&tmp);
          appendinfo(&pbVar6->info,tmp.Chars);
        }
      }
      if (!bVar1) {
        appendinfo(&pbVar6->info,"playerclass");
        appendinfo(&pbVar6->info,"random");
      }
      if ((local_12d & 1) == 0) {
        appendinfo(&pbVar6->info,"team");
        appendinfo(&pbVar6->info,"255");
      }
      pbVar6->next = bglobal.botinfo;
      pbVar6->lastteam = 0xff;
      local_134 = local_134 + 1;
      bglobal.botinfo = pbVar6;
    }
    Printf("%d bots read from %s\n",(ulong)local_134,"bots.cfg");
    this_local._7_1_ = true;
  }
  FString::~FString(&local_120);
  FScanner::~FScanner((FScanner *)&tmp);
  return this_local._7_1_;
}

Assistant:

bool FCajunMaster::LoadBots ()
{
	FScanner sc;
	FString tmp;
	bool gotteam = false;
	int loaded_bots = 0;

	bglobal.ForgetBots ();
	tmp = M_GetCajunPath(BOTFILENAME);
	if (tmp.IsEmpty())
	{
		DPrintf (DMSG_ERROR, "No " BOTFILENAME ", so no bots\n");
		return false;
	}
	try
	{
		sc.OpenFile(tmp);
	}
	catch (CRecoverableError &err)
	{
		Printf("%s. So no bots\n", err.GetMessage());
		return false;
	}

	while (sc.GetString ())
	{
		if (!sc.Compare ("{"))
		{
			sc.ScriptError ("Unexpected token '%s'\n", sc.String);
		}

		botinfo_t *newinfo = new botinfo_t;
		bool gotclass = false;

		memset (newinfo, 0, sizeof(*newinfo));

		newinfo->info = copystring ("\\autoaim\\0\\movebob\\.25");

		for (;;)
		{
			sc.MustGetString ();
			if (sc.Compare ("}"))
				break;

			switch (sc.MatchString (BotConfigStrings))
			{
			case BOTCFG_NAME:
				sc.MustGetString ();
				appendinfo (newinfo->info, "name");
				appendinfo (newinfo->info, sc.String);
				newinfo->name = copystring (sc.String);
				break;

			case BOTCFG_AIMING:
				sc.MustGetNumber ();
				newinfo->skill.aiming = sc.Number;
				break;

			case BOTCFG_PERFECTION:
				sc.MustGetNumber ();
				newinfo->skill.perfection = sc.Number;
				break;

			case BOTCFG_REACTION:
				sc.MustGetNumber ();
				newinfo->skill.reaction = sc.Number;
				break;

			case BOTCFG_ISP:
				sc.MustGetNumber ();
				newinfo->skill.isp = sc.Number;
				break;

			case BOTCFG_TEAM:
				{
					char teamstr[16];
					BYTE teamnum;

					sc.MustGetString ();
					if (IsNum (sc.String))
					{
						teamnum = atoi (sc.String);
						if (!TeamLibrary.IsValidTeam (teamnum))
						{
							teamnum = TEAM_NONE;
						}
					}
					else
					{
						teamnum = TEAM_NONE;
						for (unsigned int i = 0; i < Teams.Size(); ++i)
						{
							if (stricmp (Teams[i].GetName (), sc.String) == 0)
							{
								teamnum = i;
								break;
							}
						}
					}
					appendinfo (newinfo->info, "team");
					mysnprintf (teamstr, countof(teamstr), "%d", teamnum);
					appendinfo (newinfo->info, teamstr);
					gotteam = true;
					break;
				}

			default:
				if (stricmp (sc.String, "playerclass") == 0)
				{
					gotclass = true;
				}
				appendinfo (newinfo->info, sc.String);
				sc.MustGetString ();
				appendinfo (newinfo->info, sc.String);
				break;
			}
		}
		if (!gotclass)
		{ // Bots that don't specify a class get a random one
			appendinfo (newinfo->info, "playerclass");
			appendinfo (newinfo->info, "random");
		}
		if (!gotteam)
		{ // Same for bot teams
			appendinfo (newinfo->info, "team");
			appendinfo (newinfo->info, "255");
		}
		newinfo->next = bglobal.botinfo;
		newinfo->lastteam = TEAM_NONE;
		bglobal.botinfo = newinfo;
		loaded_bots++;
	}
	Printf ("%d bots read from %s\n", loaded_bots, BOTFILENAME);
	return true;
}